

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_assertion_tests.cpp
# Opt level: O0

void __thiscall
test::string_assertion_test::iu_StrTest_x_iutest_x_EqRaw_Test<char32_t>::Body
          (iu_StrTest_x_iutest_x_EqRaw_Test<char32_t> *this)

{
  bool bVar1;
  char *pcVar2;
  type **in_stack_fffffffffffffa18;
  Fixed *this_00;
  AssertionHelper local_5c8;
  Fixed local_598;
  undefined1 local_410 [8];
  AssertionResult iutest_ar_2;
  Fixed local_3b8;
  undefined1 local_230 [8];
  AssertionResult iutest_ar_1;
  Fixed local_1c8;
  undefined1 local_40 [8];
  AssertionResult iutest_ar;
  TypeParam_conflict2 *p;
  iu_StrTest_x_iutest_x_EqRaw_Test<char32_t> *this_local;
  
  iutest_ar._32_8_ = text<char32_t>::test;
  iutest::detail::AlwaysZero();
  iutest::internal::CmpHelperSTREQ<char32_t_const*,char32_t_const*>
            ((AssertionResult *)local_40,(internal *)"TestFixture::Text::test","p",
             text<char32_t>::test,(char32_t *)iutest_ar._32_8_,
             (char32_t *)&iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffa18);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    memset(&local_1c8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1c8);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_40);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_1.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0x65,pcVar2,kWarning);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_1.m_result,&local_1c8);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_1.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1c8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  iutest::detail::AlwaysZero();
  iutest::internal::CmpHelperSTREQ<char32_t_const*,char32_t_const*>
            ((AssertionResult *)local_230,(internal *)"TestFixture::Text::test","p",
             text<char32_t>::test,(char32_t *)iutest_ar._32_8_,
             (char32_t *)&iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffa18);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
  if (!bVar1) {
    memset(&local_3b8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_3b8);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_230);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_2.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0x66,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_2.m_result,&local_3b8);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_2.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_3b8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_230);
  iutest::detail::AlwaysZero();
  iutest::internal::CmpHelperSTREQ<char32_t_const*,char32_t_const*>
            ((AssertionResult *)local_410,(internal *)"TestFixture::Text::test","p",
             text<char32_t>::test,(char32_t *)iutest_ar._32_8_,
             (char32_t *)&iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffa18);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_410);
  if (!bVar1) {
    this_00 = &local_598;
    memset(this_00,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(this_00);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_410);
    iutest::AssertionHelper::AssertionHelper
              (&local_5c8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0x67,pcVar2,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_5c8,&local_598);
    iutest::AssertionHelper::~AssertionHelper(&local_5c8);
    iutest::AssertionHelper::Fixed::~Fixed(&local_598);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_410);
  return;
}

Assistant:

IUTEST_TYPED_TEST(StrTest, EqRaw)
{
    const TypeParam* p = TestFixture::Text::test;
    IUTEST_INFORM_STREQ(TestFixture::Text::test, p);
    IUTEST_EXPECT_STREQ(TestFixture::Text::test, p);
    IUTEST_ASSERT_STREQ(TestFixture::Text::test, p);
}